

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_decode_chunks
               (void **idat_out,size_t *idatsize_out,uint *w,uint *h,LodePNGState *state,uchar *in,
               size_t insize)

{
  byte *data;
  LodePNGInfo *info;
  LodePNGColorMode *color;
  LodePNGColorType colortype;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  void *__ptr;
  byte *chunk;
  long lVar11;
  ulong uVar12;
  ulong chunkLength;
  ulong uVar13;
  uint uVar14;
  
  *idat_out = (void *)0x0;
  *h = 0;
  *w = 0;
  uVar7 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar7;
  if (uVar7 == 0) {
    uVar7 = *w;
    uVar14 = *h;
    if (CONCAT44(0,uVar14) * (ulong)uVar7 >> 0x3d == 0) {
      colortype = (state->info_raw).colortype;
      uVar1 = (state->info_raw).bitdepth;
      uVar9 = (state->info_png).color.bitdepth;
      uVar8 = getNumColorChannels((state->info_png).color.colortype);
      uVar8 = uVar8 * uVar9;
      uVar9 = getNumColorChannels(colortype);
      uVar9 = uVar9 * uVar1;
      if (uVar9 < uVar8) {
        uVar9 = uVar8;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)(uVar7 >> 3) * (ulong)uVar9 +
                     ((ulong)(uVar7 & 7) * (ulong)uVar9 + 7 >> 3) + 5;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = CONCAT44(0,uVar14);
      if (SUB168(auVar2 * auVar3,8) == 0) {
        __ptr = malloc(insize);
        if (__ptr == (void *)0x0) {
          state->error = 0x53;
          return 0x53;
        }
        info = &state->info_png;
        color = &(state->info_png).color;
        chunk = in + 0x21;
        iVar10 = 1;
        uVar13 = 0;
        while ((in <= chunk && (uVar12 = ((long)chunk - (long)in) + 0xc, uVar12 <= insize))) {
          if ((int)((uint)*chunk << 0x18) < 0) {
            if ((state->decoder).ignore_end != 0) {
              return 0;
            }
            uVar7 = 0x3f;
            goto LAB_0015a4fa;
          }
          uVar14 = (uint)chunk[3] | (uint)chunk[1] << 0x10 | (uint)chunk[2] << 8 |
                   (uint)*chunk << 0x18;
          chunkLength = (ulong)uVar14;
          uVar12 = uVar12 + chunkLength;
          uVar7 = 0x40;
          if ((insize < uVar12) || (uVar12 < (ulong)((long)chunk - (long)in))) goto LAB_0015a4fa;
          data = chunk + 8;
          uVar6 = lodepng_chunk_type_equals(chunk,"IDAT");
          if (uVar6 != '\0') {
            uVar7 = 0x5f;
            uVar12 = uVar13 + chunkLength;
            if ((!CARRY8(uVar13,chunkLength)) && (uVar12 <= insize)) {
              if (uVar14 != 0) {
                memcpy((void *)(uVar13 + (long)__ptr),data,chunkLength);
              }
              *idat_out = __ptr;
              *idatsize_out = uVar12;
              iVar10 = 3;
              uVar13 = uVar12;
              goto LAB_0015a034;
            }
            goto LAB_0015a4fa;
          }
          uVar6 = lodepng_chunk_type_equals(chunk,"IEND");
          if (uVar6 == '\0') {
            uVar6 = lodepng_chunk_type_equals(chunk,"PLTE");
            if (uVar6 != '\0') {
              uVar7 = readChunk_PLTE(color,data,chunkLength);
              state->error = uVar7;
              if (uVar7 != 0) goto LAB_0015a501;
              iVar10 = 2;
              goto LAB_0015a034;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"tRNS");
            if (uVar6 != '\0') {
              uVar7 = readChunk_tRNS(color,data,chunkLength);
LAB_0015a120:
              state->error = uVar7;
joined_r0x0015a1d8:
              if (uVar7 != 0) goto LAB_0015a501;
LAB_0015a034:
              bVar4 = true;
              bVar5 = false;
              goto LAB_0015a051;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"bKGD");
            if (uVar6 != '\0') {
              uVar7 = readChunk_bKGD(info,data,chunkLength);
              goto LAB_0015a120;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"tEXt");
            if (uVar6 != '\0') {
              if ((state->decoder).read_text_chunks == 0) goto LAB_0015a034;
              uVar7 = readChunk_tEXt(info,data,chunkLength);
LAB_0015a1d0:
              state->error = uVar7;
              goto joined_r0x0015a1d8;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"zTXt");
            if (uVar6 != '\0') {
              if ((state->decoder).read_text_chunks != 0) {
                uVar7 = readChunk_zTXt(info,&state->decoder,data,chunkLength);
                goto LAB_0015a1d0;
              }
              goto LAB_0015a034;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"iTXt");
            if (uVar6 != '\0') {
              if ((state->decoder).read_text_chunks != 0) {
                uVar7 = readChunk_iTXt(info,&state->decoder,data,chunkLength);
                goto LAB_0015a1d0;
              }
              goto LAB_0015a034;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"tIME");
            if (uVar6 != '\0') {
              uVar7 = readChunk_tIME(info,data,chunkLength);
              goto LAB_0015a120;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"pHYs");
            if (uVar6 != '\0') {
              uVar7 = readChunk_pHYs(info,data,chunkLength);
              goto LAB_0015a22e;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"gAMA");
            if (uVar6 != '\0') {
              if (uVar14 == 4) {
                (state->info_png).gama_defined = 1;
                uVar7 = *(uint *)(chunk + 8);
                (state->info_png).gama_gamma =
                     uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18
                ;
LAB_0015a28a:
                state->error = 0;
                goto LAB_0015a034;
              }
              uVar7 = 0x60;
              goto LAB_0015a4fa;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"cHRM");
            if (uVar6 != '\0') {
              uVar7 = readChunk_cHRM(info,data,chunkLength);
              goto LAB_0015a22e;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"sRGB");
            if (uVar6 != '\0') {
              if (uVar14 == 1) {
                (state->info_png).srgb_defined = 1;
                (state->info_png).srgb_intent = (uint)*data;
                goto LAB_0015a28a;
              }
              uVar7 = 0x62;
              goto LAB_0015a4fa;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"iCCP");
            if (uVar6 != '\0') {
              uVar7 = readChunk_iCCP(info,&state->decoder,data,chunkLength);
              state->error = uVar7;
joined_r0x0015a32a:
              if (uVar7 != 0) goto LAB_0015a501;
              bVar4 = true;
              bVar5 = false;
              goto LAB_0015a051;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"cICP");
            if (uVar6 != '\0') {
              if (uVar14 == 4) {
                (state->info_png).cicp_defined = 1;
                (state->info_png).cicp_color_primaries = (uint)chunk[8];
                (state->info_png).cicp_transfer_function = (uint)chunk[9];
                (state->info_png).cicp_matrix_coefficients = (uint)chunk[10];
                (state->info_png).cicp_video_full_range_flag = (uint)chunk[0xb];
                goto LAB_0015a28a;
              }
              uVar7 = 0x75;
              goto LAB_0015a4fa;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"mDCv");
            if (uVar6 != '\0') {
              uVar7 = readChunk_mDCv(info,data,chunkLength);
LAB_0015a22e:
              state->error = uVar7;
              goto joined_r0x0015a32a;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"cLLi");
            if (uVar6 != '\0') {
              uVar7 = readChunk_cLLi(info,data,chunkLength);
              goto LAB_0015a22e;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"eXIf");
            if (uVar6 != '\0') {
              uVar7 = lodepng_set_exif(info,data,uVar14);
              goto LAB_0015a22e;
            }
            uVar6 = lodepng_chunk_type_equals(chunk,"sBIT");
            if (uVar6 != '\0') {
              uVar7 = readChunk_sBIT(info,data,chunkLength);
              goto LAB_0015a22e;
            }
            lVar11 = 4;
            do {
              if (0x19 < (byte)((chunk[lVar11] & 0xdf) + 0xbf)) {
                uVar7 = 0x79;
                goto LAB_0015a4fa;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != 8);
            if ((chunk[6] & 0x20) != 0) {
              uVar7 = 0x7a;
              goto LAB_0015a4fa;
            }
            if (((state->decoder).ignore_critical == 0) && ((chunk[4] & 0x20) == 0)) {
              uVar7 = 0x45;
              goto LAB_0015a4fa;
            }
            if ((state->decoder).remember_unknown_chunks != 0) {
              uVar7 = lodepng_chunk_append
                                ((state->info_png).unknown_chunks_data + (iVar10 - 1U),
                                 (state->info_png).unknown_chunks_size + (iVar10 - 1U),chunk);
              state->error = uVar7;
              if (uVar7 != 0) goto LAB_0015a501;
            }
            bVar5 = false;
LAB_0015a06c:
            chunk = lodepng_chunk_next_const(chunk,in + insize);
          }
          else {
            bVar5 = true;
            bVar4 = false;
LAB_0015a051:
            if (((state->decoder).ignore_crc == 0) &&
               (uVar7 = lodepng_chunk_check_crc(chunk), uVar7 != 0)) {
              uVar7 = 0x39;
              goto LAB_0015a4fa;
            }
            if (bVar4) goto LAB_0015a06c;
          }
          if (bVar5) {
            return 0;
          }
        }
        if ((state->decoder).ignore_end != 0) {
          return 0;
        }
        uVar7 = 0x1e;
LAB_0015a4fa:
        state->error = uVar7;
LAB_0015a501:
        free(__ptr);
        return uVar7;
      }
    }
    state->error = 0x5c;
    uVar7 = 0x5c;
  }
  return uVar7;
}

Assistant:

unsigned lodepng_decode_chunks(void** idat_out, size_t* idatsize_out, unsigned* w, unsigned* h,
                               LodePNGState* state,
                               const unsigned char* in, size_t insize) {
  unsigned char IEND = 0;
  unsigned char* idat;
  size_t idatsize = 0;
  const unsigned char* chunk; /*points to beginning of next chunk*/

  /*for unknown chunk order*/
  unsigned unknown = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  unsigned critical_pos = 1; /*1 = after IHDR, 2 = after PLTE, 3 = after IDAT*/
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/


  /* safe output values in case error happens */
  *idat_out = 0;
  *w = *h = 0;

  state->error = lodepng_inspect(w, h, state, in, insize); /*reads header and resets other parameters in state->info_png*/
  if(state->error) return state->error;

  if(lodepng_pixel_overflow(*w, *h, &state->info_png.color, &state->info_raw)) {
      CERROR_RETURN_ERROR(state->error, 92); /*overflow possible due to amount of pixels*/
  }

  /*the input filesize is a safe upper bound for the sum of idat chunks size*/
  idat = (unsigned char*)lodepng_malloc(insize);
  if(!idat) CERROR_RETURN_ERROR(state->error, 83); /*alloc fail*/

  chunk = &in[33]; /*first byte of the first chunk after the header*/

  /*loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
  IDAT data is put at the start of the in buffer*/
  while(!IEND && !state->error) {
    unsigned chunkLength;
    const unsigned char* data; /*the data in the chunk*/
    size_t pos = (size_t)(chunk - in);

    /*error: next chunk out of bounds of the in buffer*/
    if(chunk < in || pos + 12 > insize) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 30);
    }

    /*length of the data of the chunk, excluding the 12 bytes for length, chunk type and CRC*/
    chunkLength = lodepng_chunk_length(chunk);
    /*error: chunk length larger than the max PNG chunk size*/
    if(chunkLength > 2147483647) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 63);
    }

    if(pos + (size_t)chunkLength + 12 > insize || pos + (size_t)chunkLength + 12 < pos) {
      CERROR_BREAK(state->error, 64); /*error: size of the in buffer too small to contain next chunk (or int overflow)*/
    }

    data = lodepng_chunk_data_const(chunk);

    unknown = 0;

    /*IDAT chunk, containing compressed image data*/
    if(lodepng_chunk_type_equals(chunk, "IDAT")) {
      size_t newsize;
      if(lodepng_addofl(idatsize, chunkLength, &newsize)) CERROR_BREAK(state->error, 95);
      if(newsize > insize) CERROR_BREAK(state->error, 95);
      lodepng_memcpy(idat + idatsize, data, chunkLength);
      idatsize += chunkLength;
      *idat_out = idat;
      *idatsize_out = idatsize;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 3;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "IEND")) {
      /*IEND chunk*/
      IEND = 1;
    } else if(lodepng_chunk_type_equals(chunk, "PLTE")) {
      /*palette chunk (PLTE)*/
      state->error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 2;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
      /*palette transparency chunk (tRNS). Even though this one is an ancillary chunk , it is still compiled
      in without 'LODEPNG_COMPILE_ANCILLARY_CHUNKS' because it contains essential color information that
      affects the alpha channel of pixels. */
      state->error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*background color chunk (bKGD)*/
    } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
      state->error = readChunk_bKGD(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
      /*text chunk (tEXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_tEXt(&state->info_png, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
      /*compressed text chunk (zTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_zTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
      /*international text chunk (iTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_iTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
      state->error = readChunk_tIME(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
      state->error = readChunk_pHYs(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
      state->error = readChunk_gAMA(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
      state->error = readChunk_cHRM(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
      state->error = readChunk_sRGB(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
      state->error = readChunk_iCCP(&state->info_png, &state->decoder, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cICP")) {
      state->error = readChunk_cICP(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "mDCv")) {
      state->error = readChunk_mDCv(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cLLi")) {
      state->error = readChunk_cLLi(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "eXIf")) {
      state->error = readChunk_eXIf(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sBIT")) {
      state->error = readChunk_sBIT(&state->info_png, data, chunkLength);
      if(state->error) break;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else /*it's not an implemented chunk type, so ignore it: skip over the data*/ {
      if(!lodepng_chunk_type_name_valid(chunk)) {
        CERROR_BREAK(state->error, 121); /* invalid chunk type name */
      }
      if(lodepng_chunk_reserved(chunk)) {
        CERROR_BREAK(state->error, 122); /* invalid third lowercase character */
      }

      /*error: unknown critical chunk (5th bit of first byte of chunk type is 0)*/
      if(!state->decoder.ignore_critical && !lodepng_chunk_ancillary(chunk)) {
        CERROR_BREAK(state->error, 69);
      }

      unknown = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      if(state->decoder.remember_unknown_chunks) {
        state->error = lodepng_chunk_append(&state->info_png.unknown_chunks_data[critical_pos - 1],
                                            &state->info_png.unknown_chunks_size[critical_pos - 1], chunk);
        if(state->error) break;
      }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }

    if(!state->decoder.ignore_crc && !unknown) /*check CRC if wanted, only on known chunk types*/ {
      if(lodepng_chunk_check_crc(chunk)) CERROR_BREAK(state->error, 57); /*invalid CRC*/
    }

    if(!IEND) chunk = lodepng_chunk_next_const(chunk, in + insize);
  }

  if (state->error) lodepng_free(idat);
  return state->error;
}